

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O0

void __thiscall Tracker::begin(Tracker *this,string *_track)

{
  bool bVar1;
  rep rVar2;
  mapped_type *pmVar3;
  _Self local_28;
  _Self local_20;
  string *local_18;
  string *_track_local;
  Tracker *this_local;
  
  if ((this->m_running & 1U) != 0) {
    local_18 = _track;
    _track_local = (string *)this;
    local_20._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>_>
         ::find(&this->m_data,_track);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>_>
         ::end(&this->m_data);
    bVar1 = std::operator==(&local_20,&local_28);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->m_tracks,local_18);
    }
    rVar2 = std::chrono::_V2::system_clock::now();
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>_>
             ::operator[](&this->m_data,local_18);
    (pmVar3->start).__d.__r = rVar2;
  }
  return;
}

Assistant:

void Tracker::begin(const std::string& _track) {
    if (!m_running)
        return;

    if ( m_data.find(_track) == m_data.end() )
        m_tracks.push_back(_track);

    m_data[_track].start = std::chrono::high_resolution_clock::now();
}